

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentDispatchTest::iterate(MapPersistentDispatchTest *this)

{
  GLchar *__s;
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MoveMapOwner MVar7;
  MessageBuilder local_658;
  MessageBuilder local_4d8;
  MoveMapOwner local_358;
  undefined1 local_348 [8];
  MapOwner source_map;
  undefined1 local_328 [8];
  MapOwner destination_map;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  undefined1 local_228 [8];
  Program program;
  undefined1 local_1a8 [8];
  Buffer source;
  Buffer destination;
  GLuint local_170;
  GLuint i;
  GLuint sum;
  GLuint modified_sum;
  GLuint sum_data [16];
  GLuint source_data [16];
  GLuint modified_sum_data [16];
  GLuint modified_source_data [16];
  GLuint destination_data [16];
  bool local_19;
  bool test_result;
  Functions *gl;
  MapPersistentDispatchTest *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  i = 0;
  local_170 = 0;
  for (destination._20_4_ = 0; (uint)destination._20_4_ < 0x10;
      destination._20_4_ = destination._20_4_ + 1) {
    modified_source_data[(ulong)(uint)destination._20_4_ + 0xe] = 0;
    modified_sum_data[(ulong)(uint)destination._20_4_ + 0xe] = 0x10 - destination._20_4_;
    sum_data[(ulong)(uint)destination._20_4_ + 0xe] = destination._20_4_;
    i = modified_sum_data[(ulong)(uint)destination._20_4_ + 0xe] + i;
    local_170 = sum_data[(ulong)(uint)destination._20_4_ + 0xe] + local_170;
    source_data[(ulong)(uint)destination._20_4_ + 0xe] = i;
    (&sum)[(uint)destination._20_4_] = local_170;
  }
  BufferStorage::Buffer::Buffer((Buffer *)&source.m_target,(this->super_TestCase).m_context);
  BufferStorage::Buffer::Buffer((Buffer *)local_1a8,(this->super_TestCase).m_context);
  BufferStorage::Buffer::InitStorage
            ((Buffer *)&source.m_target,0x90d2,0xc1,0x40,modified_source_data + 0xe);
  BufferStorage::Buffer::InitStorage((Buffer *)local_1a8,0x90d2,0xc2,0x40,sum_data + 0xe);
  BufferStorage::Program::Program((Program *)local_228,(this->super_TestCase).m_context);
  __s = iterate::compute_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,__s,&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"",(allocator<char> *)((long)&destination_map.m_buffer + 7));
  BufferStorage::Program::Init
            ((Program *)local_228,&local_248,&local_270,&local_298,&local_2c0,&local_2e8,&local_310)
  ;
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)((long)&destination_map.m_buffer + 7));
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  BufferStorage::Program::Use(gl_00,local_228._0_4_);
  BufferStorage::Buffer::Bind((Buffer *)&source.m_target);
  MVar7 = BufferStorage::Buffer::MapRange((Buffer *)&source.m_target,0,0x40,0xc1);
  source_map.m_buffer = MVar7.buffer;
  BufferStorage::Buffer::MapOwner::MapOwner
            ((MapOwner *)local_328,(MoveMapOwner *)&source_map.m_buffer);
  BufferStorage::Buffer::Bind((Buffer *)local_1a8);
  local_358 = BufferStorage::Buffer::MapRange((Buffer *)local_1a8,0,0x40,0xc2);
  BufferStorage::Buffer::MapOwner::MapOwner((MapOwner *)local_348,&local_358);
  BufferStorage::Buffer::Bind(gl_00,0,0x90d2);
  BufferStorage::Buffer::BindBase(gl_00,source.m_target,0x90d2,0);
  BufferStorage::Buffer::BindBase(gl_00,local_1a8._0_4_,0x90d2,1);
  (*gl_00->dispatchCompute)(0x10,1,1);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc04);
  (*gl_00->finish)();
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc08);
  iVar1 = memcmp((void *)local_328,&sum,0x40);
  if (iVar1 != 0) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4d8,
                        (char (*) [68])
                        "Contents of mapped region does not correspond with expected results");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d8);
  }
  local_19 = iVar1 == 0;
  *(undefined8 *)((long)local_348 + 0x30) = modified_source_data._40_8_;
  *(undefined8 *)((long)local_348 + 0x38) = modified_source_data._48_8_;
  *(undefined8 *)((long)local_348 + 0x20) = modified_source_data._24_8_;
  *(undefined8 *)((long)local_348 + 0x28) = modified_source_data._32_8_;
  *(undefined8 *)((long)local_348 + 0x10) = modified_source_data._8_8_;
  *(undefined8 *)((long)local_348 + 0x18) = modified_source_data._16_8_;
  *(undefined8 *)local_348 = modified_sum_data._56_8_;
  *(undefined8 *)((long)local_348 + 8) = modified_source_data._0_8_;
  (*gl_00->dispatchCompute)(0x10,1,1);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc18);
  (*gl_00->finish)();
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc1c);
  iVar1 = memcmp((void *)local_328,source_data + 0xe,0x40);
  if (iVar1 != 0) {
    local_19 = false;
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_658,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_658,
                        (char (*) [68])
                        "Contents of mapped region does not correspond with expected results");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_658);
  }
  BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)local_348);
  BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)local_328);
  if (local_19) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  BufferStorage::Program::~Program((Program *)local_228);
  BufferStorage::Buffer::~Buffer((Buffer *)local_1a8);
  BufferStorage::Buffer::~Buffer((Buffer *)&source.m_target);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentDispatchTest::iterate()
{
	static const GLchar* compute_shader = "#version 430 core\n"
										  "\n"
										  "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
										  "\n"
										  "layout (binding = 0, std430) buffer DestinationData {\n"
										  "    uint values[];\n"
										  "} destination;\n"
										  "\n"
										  "layout (binding = 1, std430) buffer SourceData {\n"
										  "    uint values[];\n"
										  "} source;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    uint index = gl_GlobalInvocationID.x;\n"
										  "    uint sum   = 0u;\n"
										  "\n"
										  "    for (uint i = 0u; i <= index; ++i)\n"
										  "    {\n"
										  "        sum += source.values[i];\n"
										  "    }\n"
										  "\n"
										  "    destination.values[index] = sum;\n"
										  "}\n"
										  "\n";
	static const GLuint data_size			= 16;
	static const GLuint destination_binding = 0;
	static const GLuint source_binding		= 1;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLuint destination_data[data_size];
	GLuint modified_source_data[data_size];
	GLuint modified_sum_data[data_size];
	GLuint source_data[data_size];
	GLuint sum_data[data_size];

	GLuint modified_sum = 0;
	GLuint sum			= 0;

	for (GLuint i = 0; i < data_size; ++i)
	{
		destination_data[i]		= 0;
		modified_source_data[i] = data_size - i;
		source_data[i]			= i;

		modified_sum += modified_source_data[i];
		sum += source_data[i];

		modified_sum_data[i] = modified_sum;
		sum_data[i]			 = sum;
	}

	/* Prepare buffers */
	Buffer destination(m_context);
	Buffer source(m_context);

	destination.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT,
							data_size * sizeof(GLuint), destination_data);

	source.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT,
					   data_size * sizeof(GLuint), source_data);

	/* Prepare program */
	Program program(m_context);
	program.Init(compute_shader, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	/*
	 * - bind buffers to SHADER_STORAGE_BUFFER;
	 * - use MapBufferRange to map both buffers; <access> shall be set as follows:
	 *   * MAP_COHERENT_BIT and MAP_PERSISTENT_BIT flags set for both
	 *   * MAP_WRITE_BIT flag shall be set for source;
	 *   * MAP_READ_BIT flag shall be set for destination;
	 * - dispatch program for 16x1x1 groups;
	 * - modify contents of source buffer via mapped memory;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on original content of source buffer;
	 * - dispatch program for 16x1x1 groups;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on modified content of source buffer.
	 */
	{
		/* Set program */
		Program::Use(gl, program.m_id);

		/* Map buffers */
		destination.Bind();
		const Buffer::MapOwner destination_map(destination.MapRange(
			0 /* offset */, data_size * sizeof(GLuint), GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT));

		source.Bind();
		const Buffer::MapOwner source_map(
			source.MapRange(0 /* offset */, data_size * sizeof(GLuint),
							GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT));

		/* Clear binding point */
		Buffer::Bind(gl, 0, GL_SHADER_STORAGE_BUFFER);

		/* Bind buffers */
		Buffer::BindBase(gl, destination.m_id, GL_SHADER_STORAGE_BUFFER, destination_binding);
		Buffer::BindBase(gl, source.m_id, GL_SHADER_STORAGE_BUFFER, source_binding);

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}

		/* Modify source buffer via mapped area */
		memcpy(source_map.m_data, modified_source_data, data_size * sizeof(GLuint));

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, modified_sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}